

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySubImage3D.cpp
# Opt level: O3

void __thiscall
glcts::TextureCubeMapArraySubImage3D::deletePixelUnpackBuffer(TextureCubeMapArraySubImage3D *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x40))(0x88ec,0);
  if (this->m_pixel_buffer_id != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x438))(1,&this->m_pixel_buffer_id);
    this->m_pixel_buffer_id = 0;
  }
  return;
}

Assistant:

void TextureCubeMapArraySubImage3D::deletePixelUnpackBuffer()
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset GLES configuration */
	gl.bindBuffer(GL_PIXEL_UNPACK_BUFFER, 0);

	/* Delete buffer object */
	if (m_pixel_buffer_id != 0)
	{
		gl.deleteBuffers(1, &m_pixel_buffer_id);
		m_pixel_buffer_id = 0;
	}
}